

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

int sat_solver2_addclause(sat_solver2 *s,lit *begin,lit *end,int Id)

{
  uint *end_00;
  char cVar1;
  lit lVar2;
  uint *begin_00;
  int **ppiVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  uint *puVar12;
  uint *puVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  clause *c;
  
  if ((s->trail_lim).size != 0) {
    __assert_fail("solver2_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50d,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if (Id == 0) {
    __assert_fail("Id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x50e,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  if (begin < end) {
    do {
      lVar2 = *begin;
      uVar16 = (s->temp_clause).cap;
      if ((s->temp_clause).size == uVar16) {
        iVar7 = (uVar16 >> 1) * 3;
        if ((int)uVar16 < 4) {
          iVar7 = uVar16 * 2;
        }
        piVar8 = (s->temp_clause).ptr;
        if (piVar8 == (int *)0x0) {
          piVar8 = (int *)malloc((long)iVar7 << 2);
        }
        else {
          piVar8 = (int *)realloc(piVar8,(long)iVar7 << 2);
        }
        (s->temp_clause).ptr = piVar8;
        if (piVar8 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_clause).cap * 9.5367431640625e-07,
                 (double)iVar7 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_clause).cap = iVar7;
      }
      iVar7 = (s->temp_clause).size;
      (s->temp_clause).size = iVar7 + 1;
      (s->temp_clause).ptr[iVar7] = lVar2;
      begin = begin + 1;
    } while (begin < end);
  }
  begin_00 = (uint *)(s->temp_clause).ptr;
  iVar7 = (s->temp_clause).size;
  iVar15 = (int)*begin_00 >> 1;
  end_00 = begin_00 + 1;
  puVar13 = begin_00 + iVar7;
  puVar9 = end_00;
  if (1 < (long)iVar7) {
    do {
      uVar16 = *puVar9;
      puVar12 = puVar9;
      iVar5 = (int)uVar16 >> 1;
      if ((int)uVar16 >> 1 <= iVar15) {
        iVar5 = iVar15;
      }
      for (; (iVar15 = iVar5, begin_00 < puVar12 && ((int)uVar16 < (int)puVar12[-1]));
          puVar12 = puVar12 + -1) {
        *puVar12 = puVar12[-1];
        iVar5 = iVar15;
      }
      *puVar12 = uVar16;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar13);
  }
  sat_solver2_setnvars(s,iVar15 + 1);
  puVar9 = end_00;
  puVar12 = end_00;
  if (1 < iVar7) {
    do {
      uVar16 = *puVar9;
      if ((uVar16 ^ puVar9[-1]) == 1) goto LAB_008d9a92;
      if (puVar9[-1] != uVar16) {
        *puVar12 = uVar16;
        puVar12 = puVar12 + 1;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar13);
  }
  if (puVar12 <= begin_00) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x52c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  lVar11 = 0;
  puVar9 = (uint *)0x0;
  uVar16 = 0;
  do {
    if ((lVar11 != 0) &&
       ((*(uint *)((long)begin_00 + lVar11) ^ *(uint *)((long)begin_00 + lVar11 + -4)) < 2)) {
      __assert_fail("i == begin || lit_var(*(i-1)) != lit_var(*i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                    ,0x533,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
    }
    uVar6 = *(uint *)((long)begin_00 + lVar11);
    cVar1 = s->assigns[(int)uVar6 >> 1];
    puVar13 = puVar12;
    if ((uVar6 & 1) == (int)cVar1) {
LAB_008d9a92:
      iVar7 = clause2_create_new(s,(lit *)begin_00,(lit *)puVar13,0,0);
      return iVar7;
    }
    if (cVar1 == '\x03') {
      puVar9 = (uint *)((long)begin_00 + lVar11);
    }
    uVar16 = uVar16 + (cVar1 != '\x03');
    lVar4 = lVar11 + 4;
    lVar11 = lVar11 + 4;
  } while ((uint *)((long)begin_00 + lVar4) < puVar12);
  uVar14 = (long)puVar12 - (long)begin_00 >> 2;
  if ((long)uVar14 <= (long)(ulong)uVar16) {
    __assert_fail("count < end-begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x53c,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
  }
  uVar6 = *puVar9;
  *puVar9 = *begin_00;
  *begin_00 = uVar6;
  uVar6 = clause2_create_new(s,(lit *)begin_00,(lit *)puVar12,0,0);
  uVar10 = (s->Mem).uPageMask & uVar6;
  if (uVar10 == 0) {
LAB_008d9c28:
    __assert_fail("k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                  ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
  }
  ppiVar3 = (s->Mem).pPages;
  puVar13 = (uint *)(ppiVar3[(int)uVar6 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar10);
  puVar13[(ulong)(*puVar13 >> 0xb) + 1] = Id;
  if ((uVar14 == uVar16 + 1) && (s->fProofLogging != 0)) {
    if (uVar16 == 0) {
      uVar16 = (int)*begin_00 >> 1;
      if (((int)uVar16 < 0) || (s->size <= (int)uVar16)) {
LAB_008d9c66:
        __assert_fail("v >= 0 && v < s->size && !s->units[v]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x99,"void var_set_unit_clause(sat_solver2 *, int, cla)");
      }
      if (s->units[uVar16] != 0) goto LAB_008d9c66;
      s->units[uVar16] = uVar6;
      s->nUnits = s->nUnits + 1;
      uVar16 = *begin_00;
      iVar7 = (int)uVar16 >> 1;
      uVar10 = (uint)s->assigns[iVar7];
      if (uVar10 != 3) {
        if ((uVar16 & 1) == uVar10) {
          return uVar6;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x551,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
      }
      s->assigns[iVar7] = (byte)uVar16 & 1;
      s->levels[iVar7] = (s->trail_lim).size;
      s->reasons[iVar7] = 0;
    }
    else {
      uVar16 = (s->Mem).uPageMask & uVar6;
      if (uVar16 == 0) goto LAB_008d9c28;
      piVar8 = ppiVar3[(int)uVar6 >> ((byte)(s->Mem).nPageSize & 0x1f)];
      c = (clause *)(piVar8 + (int)uVar16);
      proof_chain_start(s,c);
      if (0xfff < (uint)*c) {
        uVar14 = 1;
        do {
          uVar10 = piVar8[(long)(int)uVar16 + uVar14 + 1];
          if (uVar10 < 2) break;
          proof_chain_resolve(s,(clause *)0x0,(int)uVar10 >> 1);
          uVar14 = uVar14 + 1;
        } while (uVar14 < (uint)*c >> 0xb);
      }
      iVar7 = proof_chain_stop(s);
      iVar7 = clause2_create_new(s,(lit *)begin_00,(lit *)end_00,1,iVar7);
      uVar16 = (int)*begin_00 >> 1;
      if (((int)uVar16 < 0) || (s->size <= (int)uVar16)) goto LAB_008d9c66;
      if (s->units[uVar16] != 0) goto LAB_008d9c66;
      s->units[uVar16] = iVar7;
      s->nUnits = s->nUnits + 1;
      uVar16 = *begin_00;
      iVar7 = (int)uVar16 >> 1;
      uVar10 = (uint)s->assigns[iVar7];
      if (uVar10 != 3) {
        if ((uVar16 & 1) == uVar10) {
          return uVar6;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                      ,0x560,"int sat_solver2_addclause(sat_solver2 *, lit *, lit *, int)");
      }
      s->assigns[iVar7] = (byte)uVar16 & 1;
      s->levels[iVar7] = (s->trail_lim).size;
      s->reasons[iVar7] = uVar6;
    }
    iVar7 = s->qtail;
    s->qtail = iVar7 + 1;
    s->trail[iVar7] = uVar16;
  }
  return uVar6;
}

Assistant:

int sat_solver2_addclause(sat_solver2* s, lit* begin, lit* end, int Id)
{
    cla Cid;
    lit *i,*j,*iFree = NULL;
    int maxvar, count, temp;
    assert( solver2_dlevel(s) == 0 );
    assert( begin < end );
    assert( Id != 0 );

    // copy clause into storage
    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver2_setnvars(s,maxvar+1);


    // delete duplicates
    for (i = j = begin + 1; i < end; i++)
    {
        if ( *(i-1) == lit_neg(*i) ) // tautology
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( *(i-1) != *i )
            *j++ = *i;
    }
    end = j;
    assert( begin < end );

    // coount the number of 0-literals
    count = 0;
    for ( i = begin; i < end; i++ )
    {
        // make sure all literals are unique
        assert( i == begin || lit_var(*(i-1)) != lit_var(*i) );
        // consider the value of this literal
        if ( var_value(s, lit_var(*i)) == lit_sign(*i) ) // this clause is always true
            return clause2_create_new( s, begin, end, 0, 0 ); // add it anyway, to preserve proper clause count       
        if ( var_value(s, lit_var(*i)) == varX ) // unassigned literal
            iFree = i;
        else
            count++; // literal is 0
    }
    assert( count < end-begin ); // the clause cannot be UNSAT

    // swap variables to make sure the clause is watched using unassigned variable
    temp   = *iFree;
    *iFree = *begin;
    *begin = temp;

    // create a new clause
    Cid = clause2_create_new( s, begin, end, 0, 0 );
    if ( Id )
        clause2_set_id( s, Cid, Id );

    // handle unit clause
    if ( count+1 == end-begin )
    {
        if ( s->fProofLogging )
        {
            if ( count == 0 ) // original learned clause
            {
                var_set_unit_clause( s, lit_var(begin[0]), Cid );
                if ( !solver2_enqueue(s,begin[0],0) )
                    assert( 0 );
            }
            else
            {
                // Log production of top-level unit clause:
                int x, k, proof_id, CidNew;
                clause* c = clause2_read(s, Cid);
                proof_chain_start( s, c );
                clause_foreach_var( c, x, k, 1 )
                    proof_chain_resolve( s, NULL, x );
                proof_id = proof_chain_stop( s );
                // generate a new clause
                CidNew = clause2_create_new( s, begin, begin+1, 1, proof_id );
                var_set_unit_clause( s, lit_var(begin[0]), CidNew );
                if ( !solver2_enqueue(s,begin[0],Cid) )
                    assert( 0 );
            }
        }
    }
    return Cid;
}